

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2num(long *val,char *str)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  long num;
  char *endptr;
  char *str_local;
  long *val_local;
  
  if (((str == (char *)0x0) ||
      (endptr = str, str_local = (char *)val, lVar2 = strtol(str,(char **)&num,10), pcVar1 = endptr,
      (char *)num == endptr)) || (sVar3 = strlen(endptr), (char *)num != pcVar1 + sVar3)) {
    val_local._4_4_ = PARAM_BAD_NUMERIC;
  }
  else {
    *(long *)str_local = lVar2;
    val_local._4_4_ = PARAM_OK;
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr;
    long num = strtol(str, &endptr, 10);
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}